

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyagg_impl.h
# Opt level: O0

int secp256k1_keyagg_cache_load
              (secp256k1_context *ctx,secp256k1_keyagg_cache_internal *cache_i,
              secp256k1_musig_keyagg_cache *cache)

{
  int iVar1;
  uchar *data;
  secp256k1_ge *in_RDX;
  uchar *in_RSI;
  secp256k1_scalar *in_RDI;
  uchar *ptr;
  secp256k1_ge *in_stack_00000020;
  char *pcVar2;
  secp256k1_ge *ge;
  uint local_4;
  
  ge = in_RDX;
  iVar1 = secp256k1_memcmp_var(in_RDX,secp256k1_musig_keyagg_cache_magic,4);
  if (iVar1 == 0) {
    pcVar2 = (char *)((long)(in_RDX->x).n + 4);
    secp256k1_ge_from_bytes(in_stack_00000020,(uchar *)ctx);
    data = (uchar *)(pcVar2 + 0x40);
    secp256k1_ge_from_bytes_ext(ge,data);
    *(undefined8 *)(in_RSI + 0xb0) = *(undefined8 *)(data + 0x40);
    *(undefined8 *)(in_RSI + 0xb8) = *(undefined8 *)(data + 0x48);
    *(undefined8 *)(in_RSI + 0xc0) = *(undefined8 *)(data + 0x50);
    *(undefined8 *)(in_RSI + 200) = *(undefined8 *)(data + 0x58);
    *(uint *)(in_RSI + 0xf0) = data[0x60] & 1;
    secp256k1_scalar_set_b32(in_RDI,in_RSI,(int *)ge);
  }
  else {
    secp256k1_callback_call((secp256k1_callback *)ge,(char *)in_RDX);
  }
  local_4 = (uint)(iVar1 == 0);
  return local_4;
}

Assistant:

static int secp256k1_keyagg_cache_load(const secp256k1_context* ctx, secp256k1_keyagg_cache_internal *cache_i, const secp256k1_musig_keyagg_cache *cache) {
    const unsigned char *ptr = cache->data;
    ARG_CHECK(secp256k1_memcmp_var(ptr, secp256k1_musig_keyagg_cache_magic, 4) == 0);
    ptr += 4;
    secp256k1_ge_from_bytes(&cache_i->pk, ptr);
    ptr += 64;
    secp256k1_ge_from_bytes_ext(&cache_i->second_pk, ptr);
    ptr += 64;
    memcpy(cache_i->pks_hash, ptr, 32);
    ptr += 32;
    cache_i->parity_acc = *ptr & 1;
    ptr += 1;
    secp256k1_scalar_set_b32(&cache_i->tweak, ptr, NULL);
    return 1;
}